

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RowSetClear(void *pArg)

{
  undefined8 *puVar1;
  undefined8 *p;
  
  p = *pArg;
  while (p != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*p;
    sqlite3DbFreeNN(*(sqlite3 **)((long)pArg + 8),p);
    p = puVar1;
  }
  *(undefined8 *)pArg = 0;
  *(undefined4 *)((long)pArg + 0x30) = 0x10000;
  *(undefined8 *)((long)pArg + 0x28) = 0;
  *(undefined8 *)((long)pArg + 0x10) = 0;
  *(undefined8 *)((long)pArg + 0x18) = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RowSetClear(void *pArg){
  RowSet *p = (RowSet*)pArg;
  struct RowSetChunk *pChunk, *pNextChunk;
  for(pChunk=p->pChunk; pChunk; pChunk = pNextChunk){
    pNextChunk = pChunk->pNextChunk;
    sqlite3DbFree(p->db, pChunk);
  }
  p->pChunk = 0;
  p->nFresh = 0;
  p->pEntry = 0;
  p->pLast = 0;
  p->pForest = 0;
  p->rsFlags = ROWSET_SORTED;
}